

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall IsorecursiveTest_Basics_Test::TestBody(IsorecursiveTest_Basics_Test *this)

{
  allocator<wasm::Field> *this_00;
  initializer_list<wasm::Field> __l;
  Signature signature;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Type> types;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  HeapType HVar4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar5;
  Struct *lhs;
  char *in_R9;
  Entry EVar6;
  AssertHelper local_5b0;
  Message local_5a8;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_8;
  Message local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_7;
  Message local_568;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_6;
  Message local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_5;
  Message local_528;
  uintptr_t local_520;
  Field local_518;
  Array local_508;
  Array local_4f8;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_4;
  Message local_4d0;
  allocator<wasm::Field> local_4c1;
  uintptr_t local_4c0;
  Field local_4b8;
  iterator local_4a8;
  size_type local_4a0;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_498;
  Struct local_480;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_3;
  Message local_450;
  uintptr_t local_448;
  Type local_440;
  uintptr_t *local_438;
  undefined8 local_430;
  Type local_428;
  Type local_420;
  Signature local_418;
  Signature local_408;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_2;
  Type local_3e0;
  Type newRefNullArray;
  Type local_3d0;
  Type newRefArray;
  Type local_3c0;
  Type newRefStruct;
  Type local_3b0;
  Type newRefSig;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__1;
  Message local_2c8;
  unsigned_long local_2c0;
  size_type local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Array local_218;
  Entry local_208;
  Entry local_1f8;
  Type local_1e8;
  Type TStack_1e0;
  uintptr_t local_1d0;
  Field local_1c8;
  undefined1 local_1b8 [8];
  Array array;
  Field local_198;
  iterator local_188;
  size_type local_180;
  vector<wasm::Field,_std::allocator<wasm::Field>_> local_178;
  undefined1 local_160 [8];
  Struct struct_;
  Type local_140;
  pointer *local_138;
  undefined8 local_130;
  Tuple local_128;
  uintptr_t local_110;
  Type local_108;
  undefined1 auStack_100 [8];
  Signature sig;
  Type local_e8;
  Type refNullAny;
  Type local_c8;
  Type refNullArray;
  Type local_a8;
  Type refArray;
  Type local_88;
  Type refStruct;
  Type local_68;
  Type refSig;
  AssertHelper local_58;
  Message local_50;
  unsigned_long local_48 [3];
  unsigned_long local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  TypeBuilder builder;
  IsorecursiveTest_Basics_Test *this_local;
  
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&gtest_ar.message_,3);
  local_30 = wasm::TypeBuilder::size();
  local_48[0] = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_28,"builder.size()","size_t{3}",&local_30,local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  refSig.id._5_3_ = 0;
  refSig.id._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (refSig.id._4_4_ == 0) {
    EVar6 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,0);
    refStruct.id = (uintptr_t)EVar6.builder;
    HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refStruct);
    local_68.id = wasm::TypeBuilder::getTempRefType
                            ((HeapType)&gtest_ar.message_,(Nullability)HVar4.id);
    EVar6 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,1);
    refArray.id = (uintptr_t)EVar6.builder;
    HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refArray);
    local_88.id = wasm::TypeBuilder::getTempRefType
                            ((HeapType)&gtest_ar.message_,(Nullability)HVar4.id);
    EVar6 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,2);
    refNullArray.id = (uintptr_t)EVar6.builder;
    HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refNullArray);
    local_a8.id = wasm::TypeBuilder::getTempRefType
                            ((HeapType)&gtest_ar.message_,(Nullability)HVar4.id);
    EVar6 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,2);
    refNullAny.id = (uintptr_t)EVar6.builder;
    HVar4 = wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&refNullAny);
    local_c8.id = wasm::TypeBuilder::getTempRefType
                            ((HeapType)&gtest_ar.message_,(Nullability)HVar4.id);
    wasm::HeapType::HeapType((HeapType *)&sig.results,any);
    wasm::Type::Type(&local_e8,(HeapType)sig.results.id,Nullable);
    local_108.id = local_88.id;
    struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.id;
    wasm::Type::Type(&local_140,i32);
    local_138 = &struct_.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_130 = 2;
    types._M_len = 2;
    types._M_array = (iterator)local_138;
    wasm::Tuple::Tuple(&local_128,types);
    local_110 = wasm::TypeBuilder::getTempTupleType((Tuple *)&gtest_ar.message_);
    wasm::Signature::Signature((Signature *)auStack_100,local_108,(Type)local_110);
    wasm::Tuple::~Tuple(&local_128);
    wasm::Field::Field(&local_198,local_c8,Immutable);
    local_188 = &local_198;
    local_180 = 1;
    this_00 = (allocator<wasm::Field> *)((long)&array.element.mutable_ + 3);
    std::allocator<wasm::Field>::allocator(this_00);
    __l_00._M_len = local_180;
    __l_00._M_array = local_188;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector(&local_178,__l_00,this_00);
    wasm::Struct::Struct((Struct *)local_160,&local_178);
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_178);
    std::allocator<wasm::Field>::~allocator
              ((allocator<wasm::Field> *)((long)&array.element.mutable_ + 3));
    local_1d0 = local_e8.id;
    wasm::Field::Field(&local_1c8,local_e8,Mutable);
    wasm::Array::Array((Array *)local_1b8,local_1c8);
    local_1e8.id = (uintptr_t)auStack_100;
    TStack_1e0.id = sig.params.id;
    local_1f8 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,0);
    signature.results.id = TStack_1e0.id;
    signature.params.id = local_1e8.id;
    wasm::TypeBuilder::Entry::operator=(&local_1f8,signature);
    local_208 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,1);
    wasm::TypeBuilder::Entry::operator=(&local_208,(Struct *)local_160);
    wasm::Array::Array(&local_218,(Array *)local_1b8);
    EVar6 = wasm::TypeBuilder::operator[]((TypeBuilder *)&gtest_ar.message_,2);
    result.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         EVar6.builder;
    wasm::TypeBuilder::Entry::operator=
              ((Entry *)((long)&result.
                                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        + 0x18),&local_218);
    wasm::TypeBuilder::createRecGroup((ulong)&gtest_ar.message_,0);
    wasm::TypeBuilder::build();
    testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
              ((AssertionResult *)local_258,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(internal *)local_258,
                 (AssertionResult *)"result","false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xb7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      std::__cxx11::string::~string
                ((string *)
                 &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_260);
    }
    refSig.id._5_3_ = 0;
    refSig.id._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    if (refSig.id._4_4_ == 0) {
      __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_,__x
                );
      local_2b8 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size
                            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                             &gtest_ar_1.message_);
      local_2c0 = 3;
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_2b0,"built.size()","size_t{3}",&local_2b8,&local_2c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0xb9,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_2c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_2c8);
      }
      refSig.id._5_3_ = 0;
      refSig.id._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
      if (refSig.id._4_4_ == 0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_,0
                  );
        bVar2 = wasm::HeapType::isSignature();
        local_2e1 = (bool)(bVar2 & 1);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
        if (!bVar1) {
          testing::Message::Message(&local_2f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__2.message_,(internal *)local_2e0,
                     (AssertionResult *)"built[0].isSignature()","false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xbc,pcVar3);
          testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
          testing::internal::AssertHelper::~AssertHelper(&local_2f8);
          std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_2f0);
        }
        refSig.id._5_3_ = 0;
        refSig.id._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
        if (refSig.id._4_4_ == 0) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_
                     ,1);
          bVar2 = wasm::HeapType::isStruct();
          local_329 = (bool)(bVar2 & 1);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_328,&local_329,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
          if (!bVar1) {
            testing::Message::Message(&local_338);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__3.message_,(internal *)local_328,
                       (AssertionResult *)"built[1].isStruct()","false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_340,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                       ,0xbd,pcVar3);
            testing::internal::AssertHelper::operator=(&local_340,&local_338);
            testing::internal::AssertHelper::~AssertHelper(&local_340);
            std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_338);
          }
          refSig.id._5_3_ = 0;
          refSig.id._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
          if (refSig.id._4_4_ == 0) {
            std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &gtest_ar_1.message_,2);
            bVar2 = wasm::HeapType::isArray();
            local_371 = (bool)(bVar2 & 1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_370,&local_371,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
            if (!bVar1) {
              testing::Message::Message(&local_380);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&newRefSig,(internal *)local_370,
                         (AssertionResult *)"built[2].isArray()","false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_388,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                         ,0xbe,pcVar3);
              testing::internal::AssertHelper::operator=(&local_388,&local_380);
              testing::internal::AssertHelper::~AssertHelper(&local_388);
              std::__cxx11::string::~string((string *)&newRefSig);
              testing::Message::~Message(&local_380);
            }
            refSig.id._5_3_ = 0;
            refSig.id._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
            if (refSig.id._4_4_ == 0) {
              pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,0);
              newRefStruct.id = pvVar5->id;
              wasm::Type::Type(&local_3b0,(HeapType)newRefStruct.id,NonNullable);
              pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,1);
              newRefArray.id = pvVar5->id;
              wasm::Type::Type(&local_3c0,(HeapType)newRefArray.id,NonNullable);
              pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,2);
              newRefNullArray.id = pvVar5->id;
              wasm::Type::Type(&local_3d0,(HeapType)newRefNullArray.id,NonNullable);
              pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                                 ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                                  &gtest_ar_1.message_,2);
              gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )pvVar5->id;
              wasm::Type::Type(&local_3e0,
                               (HeapType)
                               gtest_ar_2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,Nullable);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &gtest_ar_1.message_,0);
              local_408 = (Signature)wasm::HeapType::getSignature();
              local_420.id = local_3c0.id;
              local_448 = local_3d0.id;
              wasm::Type::Type(&local_440,i32);
              local_438 = &local_448;
              local_430 = 2;
              wasm::Type::Type(&local_428,local_438,2);
              wasm::Signature::Signature(&local_418,local_420,local_428);
              testing::internal::EqHelper::Compare<wasm::Signature,_wasm::Signature,_nullptr>
                        ((EqHelper *)local_3f8,"built[0].getSignature()",
                         "Signature(newRefStruct, {newRefArray, Type::i32})",&local_408,&local_418);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
              if (!bVar1) {
                testing::Message::Message(&local_450);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,199,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_3.message_,&local_450);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_)
                ;
                testing::Message::~Message(&local_450);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &gtest_ar_1.message_,1);
              lhs = (Struct *)wasm::HeapType::getStruct();
              local_4c0 = local_3e0.id;
              wasm::Field::Field(&local_4b8,local_3e0,Immutable);
              local_4a8 = &local_4b8;
              local_4a0 = 1;
              std::allocator<wasm::Field>::allocator(&local_4c1);
              __l._M_len = local_4a0;
              __l._M_array = local_4a8;
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                        (&local_498,__l,&local_4c1);
              wasm::Struct::Struct(&local_480,&local_498);
              testing::internal::EqHelper::Compare<wasm::Struct,_wasm::Struct,_nullptr>
                        ((EqHelper *)local_468,"built[1].getStruct()",
                         "Struct({Field(newRefNullArray, Immutable)})",lhs,&local_480);
              wasm::Struct::~Struct(&local_480);
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::~vector(&local_498);
              std::allocator<wasm::Field>::~allocator(&local_4c1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
              if (!bVar1) {
                testing::Message::Message(&local_4d0);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,200,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_4.message_,&local_4d0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_)
                ;
                testing::Message::~Message(&local_4d0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &gtest_ar_1.message_,2);
              wasm::HeapType::getArray();
              local_520 = local_e8.id;
              wasm::Field::Field(&local_518,local_e8,Mutable);
              wasm::Array::Array(&local_508,local_518);
              testing::internal::EqHelper::Compare<wasm::Array,_wasm::Array,_nullptr>
                        ((EqHelper *)local_4e8,"built[2].getArray()",
                         "Array(Field(refNullAny, Mutable))",&local_4f8,&local_508);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
              if (!bVar1) {
                testing::Message::Message(&local_528);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xc9,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_528);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_528);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
              testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                        ((internal *)local_540,"newRefSig","refSig",&local_3b0,&local_68);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
              if (!bVar1) {
                testing::Message::Message(&local_548);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xcc,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_6.message_,&local_548);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_)
                ;
                testing::Message::~Message(&local_548);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
              testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                        ((internal *)local_560,"newRefStruct","refStruct",&local_3c0,&local_88);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
              if (!bVar1) {
                testing::Message::Message(&local_568);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xcd,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_568);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_568);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
              testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                        ((internal *)local_580,"newRefArray","refArray",&local_3d0,&local_a8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
              if (!bVar1) {
                testing::Message::Message(&local_588);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xce,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_8.message_,&local_588);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_)
                ;
                testing::Message::~Message(&local_588);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
              testing::internal::CmpHelperNE<wasm::Type,wasm::Type>
                        ((internal *)local_5a0,"newRefNullArray","refNullArray",&local_3e0,&local_c8
                        );
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
              if (!bVar1) {
                testing::Message::Message(&local_5a8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
                testing::internal::AssertHelper::AssertHelper
                          (&local_5b0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                           ,0xcf,pcVar3);
                testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
                testing::internal::AssertHelper::~AssertHelper(&local_5b0);
                testing::Message::~Message(&local_5a8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
              refSig.id._4_4_ = 0;
            }
          }
        }
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_);
    }
    wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
    wasm::Struct::~Struct((Struct *)local_160);
  }
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, Basics) {
  // (type $sig (func (param (ref $struct)) (result (ref $array) i32)))
  // (type $struct (struct (field (ref null $array))))
  // (type $array (array (mut anyref)))
  TypeBuilder builder(3);
  ASSERT_EQ(builder.size(), size_t{3});

  Type refSig = builder.getTempRefType(builder[0], NonNullable);
  Type refStruct = builder.getTempRefType(builder[1], NonNullable);
  Type refArray = builder.getTempRefType(builder[2], NonNullable);
  Type refNullArray = builder.getTempRefType(builder[2], Nullable);
  Type refNullAny(HeapType::any, Nullable);

  Signature sig(refStruct, builder.getTempTupleType({refArray, Type::i32}));
  Struct struct_({Field(refNullArray, Immutable)});
  Array array(Field(refNullAny, Mutable));

  builder[0] = sig;
  builder[1] = struct_;
  builder[2] = array;

  builder.createRecGroup(0, 3);

  auto result = builder.build();
  ASSERT_TRUE(result);
  std::vector<HeapType> built = *result;
  ASSERT_EQ(built.size(), size_t{3});

  // The built types should have the correct kinds.
  ASSERT_TRUE(built[0].isSignature());
  ASSERT_TRUE(built[1].isStruct());
  ASSERT_TRUE(built[2].isArray());

  // The built types should have the correct structure.
  Type newRefSig = Type(built[0], NonNullable);
  Type newRefStruct = Type(built[1], NonNullable);
  Type newRefArray = Type(built[2], NonNullable);
  Type newRefNullArray = Type(built[2], Nullable);

  EXPECT_EQ(built[0].getSignature(),
            Signature(newRefStruct, {newRefArray, Type::i32}));
  EXPECT_EQ(built[1].getStruct(), Struct({Field(newRefNullArray, Immutable)}));
  EXPECT_EQ(built[2].getArray(), Array(Field(refNullAny, Mutable)));

  // The built types should be different from the temporary types.
  EXPECT_NE(newRefSig, refSig);
  EXPECT_NE(newRefStruct, refStruct);
  EXPECT_NE(newRefArray, refArray);
  EXPECT_NE(newRefNullArray, refNullArray);
}